

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O2

aura_endianness aura_get_host_endianness(void)

{
  return AURA_ENDIAN_LITTLE;
}

Assistant:

enum aura_endianness aura_get_host_endianness()
{
	union {
		uint32_t	i;
		char		c[4];
	} e = { 0x01000000 };

	if (e.c[0])
		return AURA_ENDIAN_BIG;
	else
		return AURA_ENDIAN_LITTLE;
}